

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

Result<wallet::MigrationResult> *
wallet::MigrateLegacyToDescriptor
          (Result<wallet::MigrationResult> *__return_storage_ptr__,string *wallet_name,
          SecureString *passphrase,WalletContext *context)

{
  undefined8 *puVar1;
  ulong *puVar2;
  size_type *psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  pointer *ppbVar7;
  long lVar8;
  WalletDatabase *pWVar9;
  pointer pcVar10;
  pointer __s;
  _Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_> _Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  string original;
  string original_00;
  element_type *peVar12;
  bool bVar13;
  bool bVar14;
  T *wallet_path;
  void *pvVar15;
  _Base_ptr p_Var16;
  shared_ptr<wallet::CWallet> *wallet_00;
  bilingual_str *this_00;
  __pthread_internal_list *p_Var17;
  long *args_1;
  pointer psVar18;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffff5a8;
  SecureString *pSVar19;
  pointer psVar20;
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  created_wallets;
  anon_class_40_5_0c38efe0 local_a18;
  __uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> local_9f0;
  shared_ptr<wallet::CWallet> local_wallet;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> database;
  DatabaseStatus status;
  vector<bilingual_str,_std::allocator<bilingual_str>_> warnings;
  MigrationResult local_9a8;
  undefined1 local_930 [16];
  undefined1 local_920 [24];
  _Head_base<0UL,_wallet::WalletDatabase_*,_false> local_908;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_900;
  bilingual_str local_8f0;
  undefined1 local_8b0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  DatabaseStatus status_1;
  vector<bilingual_str,_std::allocator<bilingual_str>_> warnings_1;
  path local_800;
  path local_7d8;
  path temp_backup_location;
  path local_788;
  set<fs::path,_std::less<fs::path>,_std::allocator<fs::path>_> wallet_dirs;
  undefined1 local_730 [64];
  __pthread_internal_list *local_6f0 [2];
  __pthread_internal_list local_6e0;
  undefined1 local_6d0 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6a0;
  string local_690 [16];
  __pthread_internal_list local_680;
  bilingual_str local_670;
  bool *local_630;
  undefined8 local_628;
  bool local_620 [8];
  CAmount CStack_618;
  undefined1 local_610 [32];
  path local_5f0;
  path backup_path;
  path backup_filename;
  path local_578;
  path this_wallet_dir;
  undefined1 *local_528;
  undefined8 local_520;
  undefined1 local_518;
  undefined7 uStack_517;
  undefined8 uStack_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  long *local_4e8;
  long local_4e0;
  long local_4d8 [2];
  long *local_4c8;
  long local_4c0;
  long local_4b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_428;
  undefined8 local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_408;
  undefined8 local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  long *local_3e8;
  long local_3e0;
  long local_3d8 [2];
  shared_ptr<wallet::CWallet> wallet;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> local_3a8;
  size_type local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  long *local_388;
  long local_380;
  long local_378 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e8;
  undefined8 local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c8;
  undefined8 local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  DatabaseOptions options;
  WalletContext empty_context;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0;
  undefined7 uStack_1df;
  undefined8 uStack_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  bilingual_str local_1b0;
  undefined1 *local_170;
  undefined8 local_168;
  undefined1 local_160;
  undefined7 uStack_15f;
  undefined8 uStack_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 *local_130;
  undefined8 local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  undefined8 uStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  bilingual_str error;
  MigrationResult res;
  
  lVar8 = *(long *)(in_FS_OFFSET + 0x28);
  res.wallet_name._M_dataplus._M_p = (pointer)&res.wallet_name.field_2;
  res.wallet_name._M_string_length = 0;
  res.wallet_name.field_2._M_local_buf[0] = '\0';
  res.wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  res.wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  res.watchonly_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  res.watchonly_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  res.solvables_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  res.solvables_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::filesystem::__cxx11::path::path(&res.backup_path.super_path);
  error.original._M_dataplus._M_p = (pointer)&error.original.field_2;
  error.original._M_string_length = 0;
  error.original.field_2._M_local_buf[0] = '\0';
  error.translated._M_dataplus._M_p = (pointer)&error.translated.field_2;
  error.translated._M_string_length = 0;
  error.translated.field_2._M_local_buf[0] = '\0';
  warnings.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  warnings.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  warnings.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  GetWallet((wallet *)&wallet,context,wallet_name);
  if (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    GetWalletPath((Result<fs::path> *)&empty_context,wallet_name);
    if ((char)empty_context.wallets.
              super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
              ._M_impl.super__Vector_impl_data._M_start == '\x01') {
      wallet_path = util::Result<fs::path>::value((Result<fs::path> *)&empty_context);
      BDBDataFile((path *)&options,wallet_path);
      bVar13 = IsBDBFile((path *)&options);
      std::filesystem::__cxx11::path::~path((path *)&options);
      if (!bVar13) {
        local_1f0 = &local_1e0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1f0,"Error: This wallet is already a descriptor wallet","");
        paVar5 = &local_1d0.field_2;
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_1d0._M_dataplus._M_p = (pointer)paVar5;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d0,"Error: This wallet is already a descriptor wallet","");
        }
        else {
          options.require_existing = true;
          options.require_create = true;
          options._2_2_ = 0x86;
          options.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload
          .super__Optional_payload_base<wallet::DatabaseFormat>._M_payload._M_value = BERKELEY;
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (&local_1d0,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&options);
        }
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar1;
        if (local_1f0 == &local_1e0) {
          *puVar1 = CONCAT71(uStack_1df,local_1e0);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x18)
               = uStack_1d8;
        }
        else {
          *(undefined1 **)
           &(__return_storage_ptr__->m_variant).
            super__Variant_base<bilingual_str,_wallet::MigrationResult>.
            super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = local_1f0;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                            super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                            _M_u + 0x10) = CONCAT71(uStack_1df,local_1e0);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 8) =
             local_1e8;
        local_1e8 = 0;
        local_1e0 = 0;
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x30);
        *(undefined8 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20) =
             puVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p == paVar5) {
          *puVar1 = CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                             local_1d0.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x38)
               = local_1d0.field_2._8_8_;
        }
        else {
          *(pointer *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20)
               = local_1d0._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                            super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                            _M_u + 0x30) =
               CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                        local_1d0.field_2._M_local_buf[0]);
        }
        *(size_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x28) =
             local_1d0._M_string_length;
        local_1d0._M_dataplus._M_p = (pointer)paVar5;
        local_1d0._M_string_length = 0;
        local_1d0.field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_wallet::MigrationResult>.
        super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index = '\0';
        local_1f0 = &local_1e0;
        goto LAB_00549650;
      }
      std::__detail::__variant::_Variant_storage<false,_bilingual_str,_fs::path>::~_Variant_storage
                ((_Variant_storage<false,_bilingual_str,_fs::path> *)&empty_context);
      bVar13 = true;
    }
    else {
      util::ErrorString<fs::path>(&local_1b0,(Result<fs::path> *)&empty_context);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
               0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_wallet::MigrationResult>.
        super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar1;
      paVar5 = &local_1b0.original.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.original._M_dataplus._M_p == paVar5) {
        *puVar1 = CONCAT71(local_1b0.original.field_2._M_allocated_capacity._1_7_,
                           local_1b0.original.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x18) =
             local_1b0.original.field_2._8_8_;
      }
      else {
        *(pointer *)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> =
             local_1b0.original._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                  + 0x10) =
             CONCAT71(local_1b0.original.field_2._M_allocated_capacity._1_7_,
                      local_1b0.original.field_2._M_local_buf[0]);
      }
      paVar4 = &local_1b0.translated.field_2;
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 8) =
           local_1b0.original._M_string_length;
      local_1b0.original._M_dataplus._M_p = (pointer)paVar5;
      local_1b0.original._M_string_length = 0;
      local_1b0.original.field_2._M_local_buf[0] = '\0';
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
               0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20) =
           puVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.translated._M_dataplus._M_p == paVar4) {
        *puVar1 = CONCAT71(local_1b0.translated.field_2._M_allocated_capacity._1_7_,
                           local_1b0.translated.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x38) =
             local_1b0.translated.field_2._8_8_;
      }
      else {
        *(pointer *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20) =
             local_1b0.translated._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                  + 0x30) =
             CONCAT71(local_1b0.translated.field_2._M_allocated_capacity._1_7_,
                      local_1b0.translated.field_2._M_local_buf[0]);
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x28) =
           local_1b0.translated._M_string_length;
      local_1b0.translated._M_string_length = 0;
      local_1b0.translated.field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_wallet::MigrationResult>.
      super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index = '\0';
      local_1b0.translated._M_dataplus._M_p = (pointer)paVar4;
LAB_00549650:
      std::__detail::__variant::_Variant_storage<false,_bilingual_str,_fs::path>::~_Variant_storage
                ((_Variant_storage<false,_bilingual_str,_fs::path> *)&empty_context);
      bVar13 = false;
    }
    bVar14 = false;
  }
  else if ((((wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22 & 1) == 0) {
    bVar13 = RemoveWallet(context,&wallet,(optional<bool>)0x0,&warnings);
    if (bVar13) {
      bVar13 = true;
      WaitForDeleteWallet(&wallet);
      bVar14 = true;
    }
    else {
      local_170 = &local_160;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_170,"Unable to unload the wallet before migrating","");
      paVar5 = &local_150.field_2;
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_150._M_dataplus._M_p = (pointer)paVar5;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_150,"Unable to unload the wallet before migrating","");
      }
      else {
        empty_context.chain = (Chain *)anon_var_dwarf_1da542f;
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_150,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&empty_context);
      }
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
               0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_wallet::MigrationResult>.
        super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar1;
      if (local_170 == &local_160) {
        *puVar1 = CONCAT71(uStack_15f,local_160);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x18) =
             uStack_158;
      }
      else {
        *(undefined1 **)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = local_170;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                  + 0x10) = CONCAT71(uStack_15f,local_160);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 8) =
           local_168;
      local_168 = 0;
      local_160 = 0;
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
               0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20) =
           puVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p == paVar5) {
        *puVar1 = CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                           local_150.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x38) =
             local_150.field_2._8_8_;
      }
      else {
        *(pointer *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20) =
             local_150._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                  + 0x30) =
             CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                      local_150.field_2._M_local_buf[0]);
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x28) =
           local_150._M_string_length;
      local_150._M_string_length = 0;
      bVar13 = false;
      local_150.field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_wallet::MigrationResult>.
      super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index = '\0';
      bVar14 = false;
      local_170 = &local_160;
      local_150._M_dataplus._M_p = (pointer)paVar5;
    }
  }
  else {
    local_130 = &local_120;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,"Error: This wallet is already a descriptor wallet","");
    paVar5 = &local_110.field_2;
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_110._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,"Error: This wallet is already a descriptor wallet","");
    }
    else {
      empty_context.chain = (Chain *)anon_var_dwarf_1da5422;
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_110,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&empty_context);
    }
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
             0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_wallet::MigrationResult>.
      super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar1;
    if (local_130 == &local_120) {
      *puVar1 = CONCAT71(uStack_11f,local_120);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x18) =
           uStack_118;
    }
    else {
      *(undefined1 **)
       &(__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_wallet::MigrationResult>.
        super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = local_130;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                        super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                        super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                        super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                        super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                        super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                0x10) = CONCAT71(uStack_11f,local_120);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 8) =
         local_128;
    local_128 = 0;
    local_120 = 0;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
             0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20) =
         puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == paVar5) {
      *puVar1 = CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                         local_110.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x38) =
           local_110.field_2._8_8_;
    }
    else {
      *(pointer *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20) =
           local_110._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                        super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                        super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                        super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                        super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                        super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                0x30) =
           CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,local_110.field_2._M_local_buf[0])
      ;
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x28) =
         local_110._M_string_length;
    local_110._M_string_length = 0;
    bVar13 = false;
    local_110.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_wallet::MigrationResult>.
    super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
    super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
    super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
    super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
    super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index = '\0';
    bVar14 = false;
    local_130 = &local_120;
    local_110._M_dataplus._M_p = (pointer)paVar5;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._1_7_,
               wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._0_1_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._1_7_,
                        wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_1_));
  }
  if (!bVar13) goto LAB_0054b42f;
  WalletContext::WalletContext(&empty_context);
  empty_context.args = context->args;
  options.create_flags = 0;
  options.create_passphrase._M_dataplus._M_p = (pointer)&options.create_passphrase.field_2;
  options.create_passphrase._M_string_length = 0;
  options.create_passphrase.field_2._M_local_buf[0] = '\0';
  options.verify = true;
  options.use_unsafe_sync = false;
  options.use_shared_memory = false;
  options.max_log_mb = 100;
  options.require_existing = true;
  options.require_create = false;
  options.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload.
  super__Optional_payload_base<wallet::DatabaseFormat>._M_payload._M_value = BERKELEY_RO;
  options.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload.
  super__Optional_payload_base<wallet::DatabaseFormat>._M_engaged = true;
  options.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload.
  super__Optional_payload_base<wallet::DatabaseFormat>._5_3_ = 0;
  MakeWalletDatabase((wallet *)&database,wallet_name,&options,&status,&error);
  if ((__uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>)
      database._M_t.
      super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>.
      _M_t.
      super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
      .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>)0x0) {
    local_388 = local_378;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_388,"Wallet file verification failed.","");
    paVar5 = &local_368.field_2;
    local_368._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_368,local_388,local_380 + (long)local_388);
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_348,local_388,local_380 + (long)local_388);
    local_3e8 = local_3d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8," ","");
    wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_3b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&wallet,local_3e8,local_3e0 + (long)local_3e8);
    local_3a8._M_head_impl = (_Impl *)&local_398;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a8,local_3e8,local_3e0 + (long)local_3e8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_368,
               (char *)wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ,CONCAT71(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi._1_7_,
                         wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi._0_1_));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_348,(char *)local_3a8._M_head_impl,local_3a0);
    paVar4 = &local_328.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p == paVar5) {
      local_328.field_2._8_8_ = local_368.field_2._8_8_;
      local_328._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_328._M_dataplus._M_p = local_368._M_dataplus._M_p;
    }
    local_328.field_2._M_allocated_capacity._1_7_ = local_368.field_2._M_allocated_capacity._1_7_;
    local_328.field_2._M_local_buf[0] = local_368.field_2._M_local_buf[0];
    paVar6 = &local_308.field_2;
    local_328._M_string_length = local_368._M_string_length;
    local_368._M_string_length = 0;
    local_368.field_2._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p == &local_348.field_2) {
      local_308.field_2._8_8_ = local_348.field_2._8_8_;
      local_308._M_dataplus._M_p = (pointer)paVar6;
    }
    else {
      local_308._M_dataplus._M_p = local_348._M_dataplus._M_p;
    }
    local_308.field_2._M_allocated_capacity._1_7_ = local_348.field_2._M_allocated_capacity._1_7_;
    local_308.field_2._M_local_buf[0] = local_348.field_2._M_local_buf[0];
    local_308._M_string_length = local_348._M_string_length;
    local_348._M_string_length = 0;
    local_348.field_2._M_local_buf[0] = '\0';
    local_368._M_dataplus._M_p = (pointer)paVar5;
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_328,error.original._M_dataplus._M_p,error.original._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_308,error.translated._M_dataplus._M_p,error.translated._M_string_length);
    local_2b8._M_allocated_capacity = local_308.field_2._M_allocated_capacity;
    local_2d8._M_allocated_capacity = local_328.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p == paVar4) {
      local_2d8._8_8_ = local_328.field_2._8_8_;
      local_2e8 = &local_2d8;
    }
    else {
      local_2e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p;
    }
    local_328.field_2._M_allocated_capacity =
         local_328.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p == paVar6) {
      local_2b8._8_8_ = local_308.field_2._8_8_;
      local_2c8 = &local_2b8;
    }
    else {
      local_2c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_308._M_dataplus._M_p;
    }
    local_308.field_2._M_allocated_capacity =
         local_308.field_2._M_allocated_capacity & 0xffffffffffffff00;
    puVar2 = (ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                              super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                              _M_u + 0x10);
    *(ulong **)
     &(__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_wallet::MigrationResult>.
      super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar2;
    if (local_2e8 == &local_2d8) {
      *puVar2 = local_2d8._M_allocated_capacity;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x18) =
           local_2d8._8_8_;
    }
    else {
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)&(__return_storage_ptr__->m_variant).
            super__Variant_base<bilingual_str,_wallet::MigrationResult>.
            super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = local_2e8;
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x10) =
           local_2d8._M_allocated_capacity;
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 8) =
         local_328._M_string_length;
    local_2d8._M_allocated_capacity = local_2d8._M_allocated_capacity & 0xffffffffffffff00;
    puVar2 = (ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                              super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                              _M_u + 0x30);
    *(ulong **)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20) =
         puVar2;
    if (local_2c8 == &local_2b8) {
      *puVar2 = local_2b8._M_allocated_capacity;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x38) =
           local_2b8._8_8_;
    }
    else {
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20)
           = local_2c8;
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x30) =
           local_2b8._M_allocated_capacity;
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x28) =
         local_308._M_string_length;
    local_2b8._M_allocated_capacity = local_2b8._M_allocated_capacity & 0xffffffffffffff00;
    (__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_wallet::MigrationResult>.
    super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
    super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
    super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
    super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
    super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index = '\0';
    local_2c0 = 0;
    local_2e0 = 0;
    local_308._M_string_length = 0;
    local_328._M_string_length = 0;
    local_328._M_dataplus._M_p = (pointer)paVar4;
    local_308._M_dataplus._M_p = (pointer)paVar6;
    local_2e8 = &local_2d8;
    local_2c8 = &local_2b8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_head_impl != &local_398) {
      operator_delete(local_3a8._M_head_impl,local_398._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        &local_3b8) {
      operator_delete(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      local_3b8._M_allocated_capacity + 1);
    }
    if (local_3e8 != local_3d8) {
      operator_delete(local_3e8,local_3d8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,
                      CONCAT71(local_348.field_2._M_allocated_capacity._1_7_,
                               local_348.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != paVar5) {
      operator_delete(local_368._M_dataplus._M_p,
                      CONCAT71(local_368.field_2._M_allocated_capacity._1_7_,
                               local_368.field_2._M_local_buf[0]) + 1);
    }
    if (local_388 != local_378) {
      operator_delete(local_388,local_378[0] + 1);
    }
  }
  else {
    local_9f0._M_t.
    super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>.
    super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl =
         (tuple<wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>)
         (tuple<wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>)
         database._M_t.
         super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
         ._M_t.
         super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
         .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
    database._M_t.
    super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>._M_t
    .super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>.
    super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl =
         (__uniq_ptr_data<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>,_true,_true>
          )(__uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>)
           0x0;
    args_1 = (long *)options.create_flags;
    CWallet::Create((CWallet *)&local_wallet,&empty_context,wallet_name,
                    (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                     )&local_9f0,options.create_flags,&error,&warnings);
    if ((_Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>)
        local_9f0._M_t.
        super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
        .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl !=
        (WalletDatabase *)0x0) {
      (**(code **)(*(long *)local_9f0._M_t.
                            super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                            .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl + 8
                  ))();
    }
    local_9f0._M_t.
    super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>.
    super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl =
         (tuple<wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>)
         (_Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>)
         0x0;
    if (local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      local_4c8 = local_4b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4c8,"Wallet loading failed.","");
      paVar5 = &local_4a8.field_2;
      local_4a8._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4a8,local_4c8,local_4c0 + (long)local_4c8);
      local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_488,local_4c8,local_4c0 + (long)local_4c8);
      local_4e8 = local_4d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8," ","");
      wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_3b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&wallet,local_4e8,local_4e0 + (long)local_4e8);
      local_3a8._M_head_impl = (_Impl *)&local_398;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3a8,local_4e8,local_4e0 + (long)local_4e8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_4a8,
                 (char *)wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,
                 CONCAT71(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi._1_7_,
                          wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi._0_1_));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_488,(char *)local_3a8._M_head_impl,local_3a0);
      paVar4 = &local_468.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p == paVar5) {
        local_468.field_2._8_8_ = local_4a8.field_2._8_8_;
        local_468._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_468._M_dataplus._M_p = local_4a8._M_dataplus._M_p;
      }
      local_468.field_2._M_allocated_capacity._1_7_ = local_4a8.field_2._M_allocated_capacity._1_7_;
      local_468.field_2._M_local_buf[0] = local_4a8.field_2._M_local_buf[0];
      paVar6 = &local_448.field_2;
      local_468._M_string_length = local_4a8._M_string_length;
      local_4a8._M_string_length = 0;
      local_4a8.field_2._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p == &local_488.field_2) {
        local_448.field_2._8_8_ = local_488.field_2._8_8_;
        local_448._M_dataplus._M_p = (pointer)paVar6;
      }
      else {
        local_448._M_dataplus._M_p = local_488._M_dataplus._M_p;
      }
      local_448.field_2._M_allocated_capacity._1_7_ = local_488.field_2._M_allocated_capacity._1_7_;
      local_448.field_2._M_local_buf[0] = local_488.field_2._M_local_buf[0];
      local_448._M_string_length = local_488._M_string_length;
      local_488._M_string_length = 0;
      local_488.field_2._M_local_buf[0] = '\0';
      local_4a8._M_dataplus._M_p = (pointer)paVar5;
      local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_468,error.original._M_dataplus._M_p,error.original._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_448,error.translated._M_dataplus._M_p,error.translated._M_string_length);
      local_3f8._M_allocated_capacity = local_448.field_2._M_allocated_capacity;
      local_418._M_allocated_capacity = local_468.field_2._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p == paVar4) {
        local_418._8_8_ = local_468.field_2._8_8_;
        local_428 = &local_418;
      }
      else {
        local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_468._M_dataplus._M_p;
      }
      local_468.field_2._M_allocated_capacity =
           local_468.field_2._M_allocated_capacity & 0xffffffffffffff00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p == paVar6) {
        local_3f8._8_8_ = local_448.field_2._8_8_;
        local_408 = &local_3f8;
      }
      else {
        local_408 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_448._M_dataplus._M_p;
      }
      local_448.field_2._M_allocated_capacity =
           local_448.field_2._M_allocated_capacity & 0xffffffffffffff00;
      puVar2 = (ulong *)((long)&(__return_storage_ptr__->m_variant).
                                super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                ._M_u + 0x10);
      *(ulong **)
       &(__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_wallet::MigrationResult>.
        super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar2;
      if (local_428 == &local_418) {
        *puVar2 = local_418._M_allocated_capacity;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x18) =
             local_418._8_8_;
      }
      else {
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&(__return_storage_ptr__->m_variant).
              super__Variant_base<bilingual_str,_wallet::MigrationResult>.
              super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
              super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
              super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
              super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
              super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = local_428;
        *(size_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x10) =
             local_418._M_allocated_capacity;
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 8) =
           local_468._M_string_length;
      local_418._M_allocated_capacity = local_418._M_allocated_capacity & 0xffffffffffffff00;
      puVar2 = (ulong *)((long)&(__return_storage_ptr__->m_variant).
                                super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                ._M_u + 0x30);
      *(ulong **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20) =
           puVar2;
      if (local_408 == &local_3f8) {
        *puVar2 = local_3f8._M_allocated_capacity;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x38) =
             local_3f8._8_8_;
      }
      else {
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
             0x20) = local_408;
        *(size_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x30) =
             local_3f8._M_allocated_capacity;
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x28) =
           local_448._M_string_length;
      local_3f8._M_allocated_capacity = local_3f8._M_allocated_capacity & 0xffffffffffffff00;
      (__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_wallet::MigrationResult>.
      super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index = '\0';
      local_400 = 0;
      local_420 = 0;
      local_448._M_string_length = 0;
      local_468._M_string_length = 0;
      local_468._M_dataplus._M_p = (pointer)paVar4;
      local_448._M_dataplus._M_p = (pointer)paVar6;
      local_428 = &local_418;
      local_408 = &local_3f8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_head_impl != &local_398) {
        operator_delete(local_3a8._M_head_impl,local_398._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          &local_3b8) {
        operator_delete(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,local_3b8._M_allocated_capacity + 1);
      }
      if (local_4e8 != local_4d8) {
        operator_delete(local_4e8,local_4d8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != &local_488.field_2) {
        operator_delete(local_488._M_dataplus._M_p,
                        CONCAT71(local_488.field_2._M_allocated_capacity._1_7_,
                                 local_488.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p != paVar5) {
        operator_delete(local_4a8._M_dataplus._M_p,
                        CONCAT71(local_4a8.field_2._M_allocated_capacity._1_7_,
                                 local_4a8.field_2._M_local_buf[0]) + 1);
      }
      if (local_4c8 != local_4b8) {
        operator_delete(local_4c8,local_4b8[0] + 1);
      }
    }
    else {
      local_a18.options = &options;
      local_a18.context = context;
      local_a18.status = &status;
      local_a18.error = &error;
      local_a18.warnings = &warnings;
      if ((((local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22 & 1) == 0) {
        pWVar9 = ((local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->m_database)._M_t.
                 super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                 .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
        if (pWVar9 == (WalletDatabase *)0x0) goto LAB_0054b514;
        (*pWVar9->_vptr_WalletDatabase[0xc])(&backup_path);
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  ((path *)&wallet,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&backup_path
                   ,auto_format);
        std::filesystem::__cxx11::path::path(&backup_filename.super_path,(path *)&wallet);
        std::filesystem::__cxx11::path::~path((path *)&wallet);
        std::filesystem::absolute((path *)&wallet);
        std::filesystem::__cxx11::path::path((path *)&wallet_dirs,(path *)&wallet);
        std::filesystem::__cxx11::path::~path((path *)&wallet);
        std::filesystem::__cxx11::path::parent_path();
        std::filesystem::__cxx11::path::path(&this_wallet_dir.super_path,&local_578);
        std::filesystem::__cxx11::path::~path(&local_578);
        std::filesystem::__cxx11::path::~path((path *)&wallet_dirs);
        std::filesystem::__cxx11::path::~path(&backup_filename.super_path);
        paVar5 = &backup_path.super_path._M_pathname.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)backup_path.super_path._M_pathname._M_dataplus._M_p != paVar5) {
          operator_delete(backup_path.super_path._M_pathname._M_dataplus._M_p,
                          backup_path.super_path._M_pathname.field_2._M_allocated_capacity + 1);
        }
        backup_path.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar5;
        if (wallet_name->_M_string_length == 0) {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&backup_path,"default_wallet","");
        }
        else {
          pcVar10 = (wallet_name->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&backup_path,pcVar10,pcVar10 + wallet_name->_M_string_length);
        }
        temp_backup_location.super_path._M_pathname._M_dataplus._M_p = (pointer)GetTime();
        tinyformat::format<std::__cxx11::string,long>
                  ((string *)&wallet_dirs,(tinyformat *)"%s_%d.legacy.bak",(char *)&backup_path,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &temp_backup_location,args_1);
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  ((path *)&wallet,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wallet_dirs
                   ,auto_format);
        std::filesystem::__cxx11::path::path(&backup_filename.super_path,(path *)&wallet);
        std::filesystem::__cxx11::path::~path((path *)&wallet);
        if ((_Base_ptr *)wallet_dirs._M_t._M_impl._0_8_ !=
            &wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)wallet_dirs._M_t._M_impl._0_8_,
                          (ulong)((long)&(wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)backup_path.super_path._M_pathname._M_dataplus._M_p != paVar5) {
          operator_delete(backup_path.super_path._M_pathname._M_dataplus._M_p,
                          backup_path.super_path._M_pathname.field_2._M_allocated_capacity + 1);
        }
        std::filesystem::__cxx11::path::path(&local_5f0,&this_wallet_dir.super_path);
        std::filesystem::__cxx11::path::operator/=(&local_5f0,&backup_filename.super_path);
        std::filesystem::__cxx11::path::path(&backup_path.super_path,&local_5f0);
        std::filesystem::__cxx11::path::~path(&local_5f0);
        peVar12 = local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_3b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&wallet,backup_path.super_path._M_pathname._M_dataplus._M_p,
                   backup_path.super_path._M_pathname._M_dataplus._M_p +
                   backup_path.super_path._M_pathname._M_string_length);
        bVar13 = CWallet::BackupWallet(peVar12,(string *)&wallet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            &local_3b8) {
          operator_delete(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,local_3b8._M_allocated_capacity + 1);
        }
        if (bVar13) {
          std::filesystem::__cxx11::path::operator=
                    (&res.backup_path.super_path,&backup_path.super_path);
          bVar13 = CWallet::IsLocked(local_wallet.
                                     super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
          if ((!bVar13) ||
             (pSVar19 = passphrase,
             bVar13 = CWallet::Unlock(local_wallet.
                                      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,passphrase), bVar13)) {
            wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 &(local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->cs_wallet;
            wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            ._0_1_ = 0;
            std::unique_lock<std::recursive_mutex>::lock
                      ((unique_lock<std::recursive_mutex> *)&wallet);
            bVar13 = CWallet::MigrateToSQLite
                               (local_wallet.
                                super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr,&error);
            if (bVar13) {
              if ((((local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x21 & 1) ==
                  0) {
                bVar14 = DoMigration(local_wallet.
                                     super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,context,&error,&res);
              }
              else {
                bVar14 = true;
                CWallet::SetWalletFlag
                          (local_wallet.
                           super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           0x400000000);
              }
            }
            else {
              bilingual_str::bilingual_str((bilingual_str *)local_730,&error);
              puVar1 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->m_variant).
                               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                               _M_u + 0x10);
              *(undefined8 **)
               &(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar1;
              if ((undefined1 *)local_730._0_8_ == local_730 + 0x10) {
                *puVar1 = CONCAT71(local_730._17_7_,local_730[0x10]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x18) = local_730._24_8_;
              }
              else {
                *(undefined8 *)
                 &(__return_storage_ptr__->m_variant).
                  super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                  super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> =
                     local_730._0_8_;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                  ._M_u + 0x10) = CONCAT71(local_730._17_7_,local_730[0x10]);
              }
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 8
               ) = local_730._8_8_;
              local_730._8_8_ = 0;
              local_730[0x10] = '\0';
              puVar1 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->m_variant).
                               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                               _M_u + 0x30);
              *(undefined8 **)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
               0x20) = puVar1;
              if ((_Base_ptr)local_730._32_8_ == (_Base_ptr)(local_730 + 0x30)) {
                *puVar1 = CONCAT71(local_730._49_7_,local_730[0x30]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x38) = local_730._56_8_;
              }
              else {
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x20) = local_730._32_8_;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                  ._M_u + 0x30) = CONCAT71(local_730._49_7_,local_730[0x30]);
              }
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
               0x28) = local_730._40_8_;
              local_730._40_8_ = (_Base_ptr)0x0;
              bVar14 = false;
              local_730[0x30] = '\0';
              (__return_storage_ptr__->m_variant).
              super__Variant_base<bilingual_str,_wallet::MigrationResult>.
              super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
              super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
              super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
              super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
              super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index = '\0';
              local_730._0_8_ = local_730 + 0x10;
              local_730._32_8_ = (_Base_ptr)(local_730 + 0x30);
              util::Error::~Error((Error *)local_730);
            }
            std::unique_lock<std::recursive_mutex>::~unique_lock
                      ((unique_lock<std::recursive_mutex> *)&wallet);
            if (bVar13) {
              wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header;
              wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              if (bVar14 != false) {
                pWVar9 = ((local_wallet.
                           super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         m_database)._M_t.
                         super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                         .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
                if (pWVar9 == (WalletDatabase *)0x0) {
LAB_0054b514:
                  __assert_fail("static_cast<bool>(m_database)",
                                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                                ,0x1be,
                                "virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
                }
                (*pWVar9->_vptr_WalletDatabase[0xc])(&warnings_1);
                fs::PathFromString(&temp_backup_location,(string *)&warnings_1);
                std::filesystem::__cxx11::path::parent_path();
                std::filesystem::__cxx11::path::path((path *)&wallet,&local_788);
                std::
                _Rb_tree<fs::path,_fs::path,_std::_Identity<fs::path>,_std::less<fs::path>,_std::allocator<fs::path>_>
                ::_M_insert_unique<fs::path>(&wallet_dirs._M_t,(path *)&wallet);
                std::filesystem::__cxx11::path::~path((path *)&wallet);
                std::filesystem::__cxx11::path::~path(&local_788);
                std::filesystem::__cxx11::path::~path(&temp_backup_location.super_path);
                ppbVar7 = &warnings_1.
                           super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage;
                if (warnings_1.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar7) {
                  operator_delete(warnings_1.
                                  super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (ulong)((long)&((warnings_1.
                                                                                                      
                                                  super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->original)._M_dataplus._M_p + 1));
                }
                bVar14 = MigrateLegacyToDescriptor::anon_class_40_5_0c38efe0::operator()
                                   (&local_a18,&local_wallet);
                res.wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           &res.wallet.
                            super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,
                           &local_wallet.
                            super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                          wallet_name);
                if ((bVar14) &&
                   (res.watchonly_wallet.
                    super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0)) {
                  pWVar9 = ((res.watchonly_wallet.
                             super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->m_database)._M_t.
                           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
                  if (pWVar9 == (WalletDatabase *)0x0) goto LAB_0054b514;
                  (*pWVar9->_vptr_WalletDatabase[0xc])(&warnings_1);
                  fs::PathFromString(&temp_backup_location,(string *)&warnings_1);
                  std::filesystem::__cxx11::path::parent_path();
                  std::filesystem::__cxx11::path::path((path *)&wallet,&local_7d8);
                  std::
                  _Rb_tree<fs::path,_fs::path,_std::_Identity<fs::path>,_std::less<fs::path>,_std::allocator<fs::path>_>
                  ::_M_insert_unique<fs::path>(&wallet_dirs._M_t,(path *)&wallet);
                  std::filesystem::__cxx11::path::~path((path *)&wallet);
                  std::filesystem::__cxx11::path::~path(&local_7d8);
                  std::filesystem::__cxx11::path::~path(&temp_backup_location.super_path);
                  if (warnings_1.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar7) {
                    operator_delete(warnings_1.
                                    super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (ulong)((long)&((warnings_1.
                                                                                                          
                                                  super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->original)._M_dataplus._M_p + 1));
                  }
                  bVar14 = MigrateLegacyToDescriptor::anon_class_40_5_0c38efe0::operator()
                                     (&local_a18,
                                      (shared_ptr<wallet::CWallet> *)&res.watchonly_wallet);
                }
                if ((bVar14 != false) &&
                   (res.solvables_wallet.
                    super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0)) {
                  pWVar9 = ((res.solvables_wallet.
                             super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->m_database)._M_t.
                           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
                  if (pWVar9 == (WalletDatabase *)0x0) goto LAB_0054b514;
                  (*pWVar9->_vptr_WalletDatabase[0xc])(&warnings_1);
                  fs::PathFromString(&temp_backup_location,(string *)&warnings_1);
                  std::filesystem::__cxx11::path::parent_path();
                  std::filesystem::__cxx11::path::path((path *)&wallet,&local_800);
                  std::
                  _Rb_tree<fs::path,_fs::path,_std::_Identity<fs::path>,_std::less<fs::path>,_std::allocator<fs::path>_>
                  ::_M_insert_unique<fs::path>(&wallet_dirs._M_t,(path *)&wallet);
                  std::filesystem::__cxx11::path::~path((path *)&wallet);
                  std::filesystem::__cxx11::path::~path(&local_800);
                  std::filesystem::__cxx11::path::~path(&temp_backup_location.super_path);
                  if (warnings_1.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar7) {
                    operator_delete(warnings_1.
                                    super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (ulong)((long)&((warnings_1.
                                                                                                          
                                                  super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->original)._M_dataplus._M_p + 1));
                  }
                  bVar14 = MigrateLegacyToDescriptor::anon_class_40_5_0c38efe0::operator()
                                     (&local_a18,
                                      (shared_ptr<wallet::CWallet> *)&res.solvables_wallet);
                }
              }
              if (bVar14 == false) {
                GetWalletDir();
                fsbridge::AbsPathJoin(&temp_backup_location,(path *)&wallet,&backup_filename);
                std::filesystem::__cxx11::path::~path((path *)&wallet);
                std::filesystem::copy_file
                          (&backup_path.super_path,&temp_backup_location.super_path,none);
                created_wallets.
                super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                created_wallets.
                super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                created_wallets.
                super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                if (local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0) {
                  std::
                  vector<std::shared_ptr<wallet::CWallet>,std::allocator<std::shared_ptr<wallet::CWallet>>>
                  ::emplace_back<std::shared_ptr<wallet::CWallet>>
                            ((vector<std::shared_ptr<wallet::CWallet>,std::allocator<std::shared_ptr<wallet::CWallet>>>
                              *)&created_wallets,&local_wallet);
                }
                if (res.watchonly_wallet.
                    super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0) {
                  std::
                  vector<std::shared_ptr<wallet::CWallet>,std::allocator<std::shared_ptr<wallet::CWallet>>>
                  ::emplace_back<std::shared_ptr<wallet::CWallet>>
                            ((vector<std::shared_ptr<wallet::CWallet>,std::allocator<std::shared_ptr<wallet::CWallet>>>
                              *)&created_wallets,
                             (shared_ptr<wallet::CWallet> *)&res.watchonly_wallet);
                }
                if (res.solvables_wallet.
                    super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0) {
                  std::
                  vector<std::shared_ptr<wallet::CWallet>,std::allocator<std::shared_ptr<wallet::CWallet>>>
                  ::emplace_back<std::shared_ptr<wallet::CWallet>>
                            ((vector<std::shared_ptr<wallet::CWallet>,std::allocator<std::shared_ptr<wallet::CWallet>>>
                              *)&created_wallets,
                             (shared_ptr<wallet::CWallet> *)&res.solvables_wallet);
                }
                if (created_wallets.
                    super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    created_wallets.
                    super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  psVar18 = created_wallets.
                            super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  psVar20 = created_wallets.
                            super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  do {
                    _Var11.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl =
                         (((psVar18->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->m_database)._M_t.
                         super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                         .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>;
                    if (_Var11.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl
                        == (WalletDatabase *)0x0) goto LAB_0054b514;
                    (**(code **)(*(long *)_Var11.
                                          super__Head_base<0UL,_wallet::WalletDatabase_*,_false>.
                                          _M_head_impl + 0x60))(&local_870);
                    std::filesystem::__cxx11::path::
                    path<std::__cxx11::string,std::filesystem::__cxx11::path>
                              ((path *)&wallet,&local_870,auto_format);
                    std::filesystem::__cxx11::path::path((path *)&status_1,(path *)&wallet);
                    std::filesystem::__cxx11::path::~path((path *)&wallet);
                    std::filesystem::__cxx11::path::parent_path();
                    std::
                    _Rb_tree<fs::path,_fs::path,_std::_Identity<fs::path>,_std::less<fs::path>,_std::allocator<fs::path>_>
                    ::_M_emplace_unique<std::filesystem::__cxx11::path>
                              (&wallet_dirs._M_t,(path *)&warnings_1);
                    std::filesystem::__cxx11::path::~path((path *)&warnings_1);
                    std::filesystem::__cxx11::path::~path((path *)&status_1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_870._M_dataplus._M_p != &local_870.field_2) {
                      operator_delete(local_870._M_dataplus._M_p,
                                      (ulong)(local_870.field_2._M_allocated_capacity + 1));
                    }
                    psVar18 = psVar18 + 1;
                  } while (psVar18 != psVar20);
                }
                psVar18 = created_wallets.
                          super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                for (wallet_00 = (shared_ptr<wallet::CWallet> *)
                                 created_wallets.
                                 super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                    p_Var16 = wallet_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                    wallet_00 != (shared_ptr<wallet::CWallet> *)psVar18; wallet_00 = wallet_00 + 1)
                {
                  if (((wallet_00->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->m_chain == (Chain *)0x0) {
                    this = (wallet_00->
                           super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                           _M_refcount._M_pi;
                    if ((this == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
                       (this->_M_use_count != 1)) {
                      __assert_fail("w.use_count() == 1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                                    ,0x11bf,
                                    "util::Result<MigrationResult> wallet::MigrateLegacyToDescriptor(const std::string &, const SecureString &, WalletContext &)"
                                   );
                    }
                    (wallet_00->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr = (element_type *)0x0;
                    (wallet_00->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                    }
                  }
                  else {
                    bVar13 = RemoveWallet(context,wallet_00,(optional<bool>)0x100);
                    if (!bVar13) {
                      _((bilingual_str *)&wallet,(ConstevalStringLiteral)0x86df93);
                      bilingual_str::operator+=(&error,(bilingual_str *)&wallet);
                      bilingual_str::~bilingual_str((bilingual_str *)&wallet);
                      bilingual_str::bilingual_str((bilingual_str *)local_8b0,&error);
                      puVar1 = (undefined8 *)
                               ((long)&(__return_storage_ptr__->m_variant).
                                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>
                                       .
                                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>
                                       .
                                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                       .
                                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                       .
                                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                       ._M_u + 0x10);
                      *(undefined8 **)
                       &(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                        super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                        super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                        super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                        super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                        super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> =
                           puVar1;
                      if ((undefined1 *)local_8b0._0_8_ == local_8b0 + 0x10) {
                        *puVar1 = CONCAT71(local_8b0._17_7_,local_8b0[0x10]);
                        *(undefined8 *)
                         ((long)&(__return_storage_ptr__->m_variant).
                                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                 ._M_u + 0x18) = local_8b0._24_8_;
                      }
                      else {
                        *(undefined8 *)
                         &(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> =
                             local_8b0._0_8_;
                        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                          super__Variant_base<bilingual_str,_wallet::MigrationResult>
                                          .
                                          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>
                                          .
                                          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>
                                          .
                                          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                          .
                                          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                          .
                                          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                          ._M_u + 0x10) = CONCAT71(local_8b0._17_7_,local_8b0[0x10])
                        ;
                      }
                      *(undefined8 *)
                       ((long)&(__return_storage_ptr__->m_variant).
                               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                               _M_u + 8) = local_8b0._8_8_;
                      local_8b0._8_8_ = 0;
                      local_8b0[0x10] = _S_red;
                      puVar1 = (undefined8 *)
                               ((long)&(__return_storage_ptr__->m_variant).
                                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>
                                       .
                                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>
                                       .
                                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                       .
                                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                       .
                                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                       ._M_u + 0x30);
                      *(undefined8 **)
                       ((long)&(__return_storage_ptr__->m_variant).
                               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                               _M_u + 0x20) = puVar1;
                      if ((_Base_ptr)local_8b0._32_8_ == (_Base_ptr)(local_8b0 + 0x30)) {
                        *puVar1 = CONCAT71(local_8b0._49_7_,local_8b0[0x30]);
                        *(undefined8 *)
                         ((long)&(__return_storage_ptr__->m_variant).
                                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                 ._M_u + 0x38) = local_8b0._56_8_;
                      }
                      else {
                        *(undefined8 *)
                         ((long)&(__return_storage_ptr__->m_variant).
                                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                 ._M_u + 0x20) = local_8b0._32_8_;
                        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                          super__Variant_base<bilingual_str,_wallet::MigrationResult>
                                          .
                                          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>
                                          .
                                          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>
                                          .
                                          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                          .
                                          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                          .
                                          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                          ._M_u + 0x30) = CONCAT71(local_8b0._49_7_,local_8b0[0x30])
                        ;
                      }
                      *(undefined8 *)
                       ((long)&(__return_storage_ptr__->m_variant).
                               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                               _M_u + 0x28) = local_8b0._40_8_;
                      local_8b0._40_8_ = (_Base_ptr)0x0;
                      local_8b0[0x30] = '\0';
                      (__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                      super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                      super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                      super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                      super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                      super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index
                           = '\0';
                      local_8b0._0_8_ = local_8b0 + 0x10;
                      local_8b0._32_8_ = (_Base_ptr)(local_8b0 + 0x30);
                      util::Error::~Error((Error *)local_8b0);
                      goto LAB_0054b386;
                    }
                    WaitForDeleteWallet(wallet_00);
                  }
                }
                for (; (_Rb_tree_header *)p_Var16 != &wallet_dirs._M_t._M_impl.super__Rb_tree_header
                    ; p_Var16 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var16)) {
                  std::filesystem::remove_all((path *)(p_Var16 + 1));
                }
                warnings_1.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl
                .super__Vector_impl_data._M_start = (pointer)0x0;
                warnings_1.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl
                .super__Vector_impl_data._M_finish = (pointer)0x0;
                warnings_1.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                RestoreWallet((wallet *)&wallet,context,&temp_backup_location,wallet_name,
                              (optional<bool>)0x0,&status_1,&error,&warnings_1);
                peVar12 = wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    CONCAT71(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._1_7_,
                             wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._0_1_) !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             CONCAT71(wallet.
                                      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi._1_7_,
                                      wallet.
                                      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi._0_1_));
                }
                if (peVar12 == (element_type *)0x0) {
                  _((bilingual_str *)&wallet,(ConstevalStringLiteral)0x86e046);
                  bilingual_str::operator+=(&error,(bilingual_str *)&wallet);
                  bilingual_str::~bilingual_str((bilingual_str *)&wallet);
                  this_00 = &local_8f0;
                  bilingual_str::bilingual_str(this_00,&error);
                  puVar1 = (undefined8 *)
                           ((long)&(__return_storage_ptr__->m_variant).
                                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                   ._M_u + 0x10);
                  *(undefined8 **)
                   &(__return_storage_ptr__->m_variant).
                    super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                    super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar1;
                  paVar5 = &local_8f0.original.field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_8f0.original._M_dataplus._M_p == paVar5) {
                    *puVar1 = CONCAT71(local_8f0.original.field_2._M_allocated_capacity._1_7_,
                                       local_8f0.original.field_2._M_local_buf[0]);
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->m_variant).
                             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                             _M_u + 0x18) = local_8f0.original.field_2._8_8_;
                  }
                  else {
                    *(pointer *)
                     &(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                      super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                      super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                      super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                      super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                      super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> =
                         local_8f0.original._M_dataplus._M_p;
                    *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                      super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                      super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>
                                      .
                                      super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>
                                      .
                                      super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                      .
                                      super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                      .
                                      super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                      ._M_u + 0x10) =
                         CONCAT71(local_8f0.original.field_2._M_allocated_capacity._1_7_,
                                  local_8f0.original.field_2._M_local_buf[0]);
                  }
                  paVar4 = &local_8f0.translated.field_2;
                  *(size_type *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                           super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                   + 8) = local_8f0.original._M_string_length;
                  local_8f0.original._M_string_length = 0;
                  local_8f0.original.field_2._M_local_buf[0] = '\0';
                  psVar3 = (size_type *)
                           ((long)&(__return_storage_ptr__->m_variant).
                                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                   ._M_u + 0x30);
                  *(size_type **)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                           super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                   + 0x20) = psVar3;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_8f0.translated._M_dataplus._M_p == paVar4) {
                    *psVar3 = local_8f0.translated.field_2._M_allocated_capacity;
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->m_variant).
                             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                             _M_u + 0x38) = local_8f0.translated.field_2._8_8_;
                  }
                  else {
                    *(pointer *)
                     ((long)&(__return_storage_ptr__->m_variant).
                             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                             _M_u + 0x20) = local_8f0.translated._M_dataplus._M_p;
                    *(size_type *)
                     ((long)&(__return_storage_ptr__->m_variant).
                             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                             _M_u + 0x30) = local_8f0.translated.field_2._M_allocated_capacity;
                  }
                  *(size_type *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                           super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                   + 0x28) = local_8f0.translated._M_string_length;
                  local_8f0.original._M_dataplus._M_p = (pointer)paVar5;
                  local_8f0.translated._M_dataplus._M_p = (pointer)paVar4;
                }
                else {
                  std::filesystem::copy_file
                            (&temp_backup_location.super_path,&backup_path.super_path,none);
                  std::filesystem::remove(&temp_backup_location.super_path);
                  this_00 = (bilingual_str *)local_930;
                  bilingual_str::bilingual_str(this_00,&error);
                  puVar1 = (undefined8 *)
                           ((long)&(__return_storage_ptr__->m_variant).
                                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                   ._M_u + 0x10);
                  *(undefined8 **)
                   &(__return_storage_ptr__->m_variant).
                    super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                    super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar1;
                  if ((Chain *)local_930._0_8_ == (Chain *)local_920) {
                    *puVar1 = CONCAT71(local_920._1_7_,local_920[0]);
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->m_variant).
                             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                             _M_u + 0x18) = local_920._8_8_;
                  }
                  else {
                    *(undefined8 *)
                     &(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                      super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                      super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                      super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                      super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                      super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> =
                         local_930._0_8_;
                    *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                      super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                      super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>
                                      .
                                      super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>
                                      .
                                      super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                      .
                                      super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>
                                      .
                                      super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                      ._M_u + 0x10) = CONCAT71(local_920._1_7_,local_920[0]);
                  }
                  *(undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                           super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                   + 8) = local_930._8_8_;
                  local_930._8_8_ = (pointer)0x0;
                  local_920[0] = '\0';
                  psVar3 = (size_type *)
                           ((long)&(__return_storage_ptr__->m_variant).
                                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                   ._M_u + 0x30);
                  *(size_type **)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                           super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                   + 0x20) = psVar3;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_920._16_8_ == &local_900) {
                    *psVar3 = local_900._M_allocated_capacity;
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->m_variant).
                             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                             _M_u + 0x38) = local_900._8_8_;
                  }
                  else {
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->m_variant).
                             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                             _M_u + 0x20) = local_920._16_8_;
                    *(size_type *)
                     ((long)&(__return_storage_ptr__->m_variant).
                             super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                             super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                             super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                             _M_u + 0x30) = local_900._M_allocated_capacity;
                  }
                  *(WalletDatabase **)
                   ((__return_storage_ptr__->m_variant).
                    super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                    super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                    super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u.
                    _M_first._M_storage._M_storage + 0x28) = local_908._M_head_impl;
                  local_930._0_8_ = (Chain *)local_920;
                  local_920._16_8_ = &local_900;
                }
                (this_00->translated)._M_string_length = 0;
                (this_00->translated).field_2._M_local_buf[0] = '\0';
                (__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index = '\0'
                ;
                util::Error::~Error((Error *)this_00);
                std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector(&warnings_1);
LAB_0054b386:
                _GLOBAL__N_1::std::
                vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                ::~vector((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                           *)&created_wallets);
                std::filesystem::__cxx11::path::~path(&temp_backup_location.super_path);
              }
              else {
                MigrationResult::MigrationResult(&local_9a8,&res);
                std::__detail::__variant::_Uninitialized<wallet::MigrationResult,_false>::
                _Uninitialized<wallet::MigrationResult>
                          ((_Uninitialized<wallet::MigrationResult,_false> *)__return_storage_ptr__,
                           &local_9a8);
                (__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index =
                     '\x01';
                MigrationResult::~MigrationResult(&local_9a8);
              }
              std::
              _Rb_tree<fs::path,_fs::path,_std::_Identity<fs::path>,_std::less<fs::path>,_std::allocator<fs::path>_>
              ::~_Rb_tree(&wallet_dirs._M_t);
            }
          }
          else {
            if (bVar14) {
              MigrateLegacyToDescriptor::anon_class_40_5_0c38efe0::operator()
                        (&local_a18,&local_wallet);
            }
            if ((passphrase->_M_string_length == 0) ||
               (__s = (passphrase->_M_dataplus)._M_p,
               pvVar15 = memchr(__s,0,passphrase->_M_string_length),
               pvVar15 == (void *)0x0 || (long)pvVar15 - (long)__s == -1)) {
              local_690._0_8_ = &local_680;
              std::__cxx11::string::_M_construct<char_const*>
                        (local_690,
                         "Error: Wallet decryption failed, the wallet passphrase was not provided or was incorrect."
                         ,"");
              original._M_string_length = (size_type)context;
              original._M_dataplus._M_p = (pointer)in_stack_fffffffffffff5a8;
              original.field_2._M_allocated_capacity = (size_type)wallet_name;
              original.field_2._8_8_ = pSVar19;
              Untranslated(&local_670,original);
              puVar1 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->m_variant).
                               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                               _M_u + 0x10);
              *(undefined8 **)
               &(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar1;
              paVar5 = &local_670.original.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670.original._M_dataplus._M_p == paVar5) {
                *puVar1 = CONCAT71(local_670.original.field_2._M_allocated_capacity._1_7_,
                                   local_670.original.field_2._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x18) = local_670.original.field_2._8_8_;
              }
              else {
                *(pointer *)
                 &(__return_storage_ptr__->m_variant).
                  super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                  super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> =
                     local_670.original._M_dataplus._M_p;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                  ._M_u + 0x10) =
                     CONCAT71(local_670.original.field_2._M_allocated_capacity._1_7_,
                              local_670.original.field_2._M_local_buf[0]);
              }
              paVar4 = &local_670.translated.field_2;
              *(size_type *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 8
               ) = local_670.original._M_string_length;
              local_670.original._M_string_length = 0;
              local_670.original.field_2._M_local_buf[0] = '\0';
              puVar1 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->m_variant).
                               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                               _M_u + 0x30);
              *(undefined8 **)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
               0x20) = puVar1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670.translated._M_dataplus._M_p == paVar4) {
                *puVar1 = CONCAT71(local_670.translated.field_2._M_allocated_capacity._1_7_,
                                   local_670.translated.field_2._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x38) = local_670.translated.field_2._8_8_;
              }
              else {
                *(pointer *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x20) = local_670.translated._M_dataplus._M_p;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                  ._M_u + 0x30) =
                     CONCAT71(local_670.translated.field_2._M_allocated_capacity._1_7_,
                              local_670.translated.field_2._M_local_buf[0]);
              }
              *(size_type *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
               0x28) = local_670.translated._M_string_length;
              local_670.translated._M_string_length = 0;
              local_670.translated.field_2._M_local_buf[0] = '\0';
              (__return_storage_ptr__->m_variant).
              super__Variant_base<bilingual_str,_wallet::MigrationResult>.
              super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
              super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
              super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
              super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
              super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index = '\0';
              local_670.original._M_dataplus._M_p = (pointer)paVar5;
              local_670.translated._M_dataplus._M_p = (pointer)paVar4;
              util::Error::~Error((Error *)&local_670);
              p_Var17 = (__pthread_internal_list *)local_690._0_8_;
              if ((__pthread_internal_list *)local_690._0_8_ != &local_680) goto LAB_0054a79c;
            }
            else {
              local_6f0[0] = &local_6e0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_6f0,anon_var_dwarf_1da548b,anon_var_dwarf_1da548b + 0x138);
              original_00._M_string_length = (size_type)context;
              original_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff5a8;
              original_00.field_2._M_allocated_capacity = (size_type)wallet_name;
              original_00.field_2._8_8_ = pSVar19;
              Untranslated((bilingual_str *)local_6d0,original_00);
              puVar1 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->m_variant).
                               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                               _M_u + 0x10);
              *(undefined8 **)
               &(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar1;
              if ((_Base_ptr)local_6d0._0_8_ == (_Base_ptr)(local_6d0 + 0x10)) {
                *puVar1 = CONCAT71(local_6d0._17_7_,local_6d0[0x10]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x18) = local_6d0._24_8_;
              }
              else {
                *(undefined8 *)
                 &(__return_storage_ptr__->m_variant).
                  super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                  super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                  super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> =
                     local_6d0._0_8_;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                  ._M_u + 0x10) = CONCAT71(local_6d0._17_7_,local_6d0[0x10]);
              }
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 8
               ) = local_6d0._8_8_;
              local_6d0._8_8_ = 0;
              local_6d0[0x10] = '\0';
              puVar1 = (undefined8 *)
                       ((long)&(__return_storage_ptr__->m_variant).
                               super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                               super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                               super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                               _M_u + 0x30);
              *(undefined8 **)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
               0x20) = puVar1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6d0._32_8_ == &local_6a0) {
                *puVar1 = CONCAT71(local_6a0._M_allocated_capacity._1_7_,local_6a0._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x38) = local_6a0._8_8_;
              }
              else {
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x20) = local_6d0._32_8_;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                                  super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>
                                  ._M_u + 0x30) =
                     CONCAT71(local_6a0._M_allocated_capacity._1_7_,local_6a0._M_local_buf[0]);
              }
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
               0x28) = local_6d0._40_8_;
              local_6d0._40_8_ = 0;
              local_6a0._M_local_buf[0] = '\0';
              (__return_storage_ptr__->m_variant).
              super__Variant_base<bilingual_str,_wallet::MigrationResult>.
              super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
              super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
              super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
              super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
              super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index = '\0';
              local_6d0._0_8_ = (_Base_ptr)(local_6d0 + 0x10);
              local_6d0._32_8_ = &local_6a0;
              util::Error::~Error((Error *)local_6d0);
              local_680.__prev = local_6e0.__prev;
              p_Var17 = local_6f0[0];
              if (local_6f0[0] != &local_6e0) {
LAB_0054a79c:
                operator_delete(p_Var17,(ulong)((long)&((_Base_ptr)local_680.__prev)->_M_color + 1))
                ;
              }
            }
          }
        }
        else {
          if (bVar14) {
            MigrateLegacyToDescriptor::anon_class_40_5_0c38efe0::operator()
                      (&local_a18,&local_wallet);
          }
          local_630 = local_620;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_630,"Error: Unable to make a backup of your wallet","");
          pcVar10 = local_610 + 0x10;
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_610._0_8_ = pcVar10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_610,"Error: Unable to make a backup of your wallet","");
          }
          else {
            wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)anon_var_dwarf_1da5463;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_610,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&wallet);
          }
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                           super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                   + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->m_variant).
            super__Variant_base<bilingual_str,_wallet::MigrationResult>.
            super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar1;
          if (local_630 == local_620) {
            *puVar1 = CONCAT71(local_620._1_7_,local_620[0]);
            *(CAmount *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
             0x18) = CStack_618;
          }
          else {
            *(bool **)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> =
                 local_630;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                              super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                              _M_u + 0x10) = CONCAT71(local_620._1_7_,local_620[0]);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 8) =
               local_628;
          local_628._0_4_ = LEGACY;
          local_628._4_4_ = (_Storage<OutputType,_true>)0x0;
          local_620[0] = false;
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                           super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                           super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u
                   + 0x30);
          *(undefined8 **)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20)
               = puVar1;
          if ((pointer)local_610._0_8_ == pcVar10) {
            *puVar1 = CONCAT71(local_610._17_7_,local_610[0x10]);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
             0x38) = local_610._24_8_;
          }
          else {
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
             0x20) = local_610._0_8_;
            *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                              super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                              super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                              _M_u + 0x30) = CONCAT71(local_610._17_7_,local_610[0x10]);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x28)
               = local_610._8_8_;
          local_610._8_8_ = (pointer)0x0;
          local_610[0x10] = '\0';
          (__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index = '\0';
          local_630 = local_620;
          local_610._0_8_ = pcVar10;
        }
        std::filesystem::__cxx11::path::~path(&backup_path.super_path);
        std::filesystem::__cxx11::path::~path(&backup_filename.super_path);
        std::filesystem::__cxx11::path::~path(&this_wallet_dir.super_path);
      }
      else {
        if (bVar14) {
          MigrateLegacyToDescriptor::anon_class_40_5_0c38efe0::operator()(&local_a18,&local_wallet);
        }
        local_528 = &local_518;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_528,"Error: This wallet is already a descriptor wallet","");
        paVar5 = &local_508.field_2;
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_508._M_dataplus._M_p = (pointer)paVar5;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_508,"Error: This wallet is already a descriptor wallet","");
        }
        else {
          wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)anon_var_dwarf_1da5422;
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (&local_508,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&wallet);
        }
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::MigrationResult>.
          super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = puVar1;
        if (local_528 == &local_518) {
          *puVar1 = CONCAT71(uStack_517,local_518);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x18)
               = uStack_510;
        }
        else {
          *(undefined1 **)
           &(__return_storage_ptr__->m_variant).
            super__Variant_base<bilingual_str,_wallet::MigrationResult>.
            super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
            super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
            super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
            super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
            super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult> = local_528;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                            super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                            _M_u + 0x10) = CONCAT71(uStack_517,local_518);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 8) =
             local_520;
        local_520 = 0;
        local_518 = 0;
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                         super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                         super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u +
                 0x30);
        *(undefined8 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20) =
             puVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p == paVar5) {
          *puVar1 = CONCAT71(local_508.field_2._M_allocated_capacity._1_7_,
                             local_508.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x38)
               = local_508.field_2._8_8_;
        }
        else {
          *(pointer *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x20)
               = local_508._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                            super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                            super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>.
                            _M_u + 0x30) =
               CONCAT71(local_508.field_2._M_allocated_capacity._1_7_,
                        local_508.field_2._M_local_buf[0]);
        }
        *(size_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::MigrationResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_u + 0x28) =
             local_508._M_string_length;
        local_508._M_string_length = 0;
        local_508.field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_wallet::MigrationResult>.
        super__Move_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::MigrationResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::MigrationResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::MigrationResult>._M_index = '\0';
        local_528 = &local_518;
        local_508._M_dataplus._M_p = (pointer)paVar5;
      }
    }
    if (local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if ((__uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>)
      database._M_t.
      super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>.
      _M_t.
      super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
      .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>)0x0) {
    (**(code **)(*(long *)database._M_t.
                          super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                          .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl + 8))
              ();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>_11
       *)options.create_passphrase._M_dataplus._M_p != &options.create_passphrase.field_2) {
    _GLOBAL__N_1::std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>
    ::_M_destroy(&options.create_passphrase,
                 CONCAT71(options.create_passphrase.field_2._M_allocated_capacity._1_7_,
                          options.create_passphrase.field_2._M_local_buf[0]));
  }
  WalletContext::~WalletContext(&empty_context);
LAB_0054b42f:
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector(&warnings);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error.translated._M_dataplus._M_p != &error.translated.field_2) {
    operator_delete(error.translated._M_dataplus._M_p,
                    CONCAT71(error.translated.field_2._M_allocated_capacity._1_7_,
                             error.translated.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error.original._M_dataplus._M_p != &error.original.field_2) {
    operator_delete(error.original._M_dataplus._M_p,
                    CONCAT71(error.original.field_2._M_allocated_capacity._1_7_,
                             error.original.field_2._M_local_buf[0]) + 1);
  }
  std::filesystem::__cxx11::path::~path(&res.backup_path.super_path);
  if (res.solvables_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               res.solvables_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (res.watchonly_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               res.watchonly_wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (res.wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               res.wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res.wallet_name._M_dataplus._M_p != &res.wallet_name.field_2) {
    operator_delete(res.wallet_name._M_dataplus._M_p,
                    CONCAT71(res.wallet_name.field_2._M_allocated_capacity._1_7_,
                             res.wallet_name.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar8) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<MigrationResult> MigrateLegacyToDescriptor(const std::string& wallet_name, const SecureString& passphrase, WalletContext& context)
{
    MigrationResult res;
    bilingual_str error;
    std::vector<bilingual_str> warnings;

    // If the wallet is still loaded, unload it so that nothing else tries to use it while we're changing it
    bool was_loaded = false;
    if (auto wallet = GetWallet(context, wallet_name)) {
        if (wallet->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
            return util::Error{_("Error: This wallet is already a descriptor wallet")};
        }

        if (!RemoveWallet(context, wallet, /*load_on_start=*/std::nullopt, warnings)) {
            return util::Error{_("Unable to unload the wallet before migrating")};
        }
        WaitForDeleteWallet(std::move(wallet));
        was_loaded = true;
    } else {
        // Check if the wallet is BDB
        const auto& wallet_path = GetWalletPath(wallet_name);
        if (!wallet_path) {
            return util::Error{util::ErrorString(wallet_path)};
        }
        if (!IsBDBFile(BDBDataFile(*wallet_path))) {
            return util::Error{_("Error: This wallet is already a descriptor wallet")};
        }
    }

    // Load the wallet but only in the context of this function.
    // No signals should be connected nor should anything else be aware of this wallet
    WalletContext empty_context;
    empty_context.args = context.args;
    DatabaseOptions options;
    options.require_existing = true;
    options.require_format = DatabaseFormat::BERKELEY_RO;
    DatabaseStatus status;
    std::unique_ptr<WalletDatabase> database = MakeWalletDatabase(wallet_name, options, status, error);
    if (!database) {
        return util::Error{Untranslated("Wallet file verification failed.") + Untranslated(" ") + error};
    }

    // Make the local wallet
    std::shared_ptr<CWallet> local_wallet = CWallet::Create(empty_context, wallet_name, std::move(database), options.create_flags, error, warnings);
    if (!local_wallet) {
        return util::Error{Untranslated("Wallet loading failed.") + Untranslated(" ") + error};
    }

    // Helper to reload as normal for some of our exit scenarios
    const auto& reload_wallet = [&](std::shared_ptr<CWallet>& to_reload) {
        // Reset options.require_format as wallets of any format may be reloaded.
        options.require_format = std::nullopt;
        assert(to_reload.use_count() == 1);
        std::string name = to_reload->GetName();
        to_reload.reset();
        to_reload = LoadWallet(context, name, /*load_on_start=*/std::nullopt, options, status, error, warnings);
        return to_reload != nullptr;
    };

    // Before anything else, check if there is something to migrate.
    if (local_wallet->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
        if (was_loaded) {
            reload_wallet(local_wallet);
        }
        return util::Error{_("Error: This wallet is already a descriptor wallet")};
    }

    // Make a backup of the DB
    fs::path this_wallet_dir = fs::absolute(fs::PathFromString(local_wallet->GetDatabase().Filename())).parent_path();
    fs::path backup_filename = fs::PathFromString(strprintf("%s_%d.legacy.bak", (wallet_name.empty() ? "default_wallet" : wallet_name), GetTime()));
    fs::path backup_path = this_wallet_dir / backup_filename;
    if (!local_wallet->BackupWallet(fs::PathToString(backup_path))) {
        if (was_loaded) {
            reload_wallet(local_wallet);
        }
        return util::Error{_("Error: Unable to make a backup of your wallet")};
    }
    res.backup_path = backup_path;

    bool success = false;

    // Unlock the wallet if needed
    if (local_wallet->IsLocked() && !local_wallet->Unlock(passphrase)) {
        if (was_loaded) {
            reload_wallet(local_wallet);
        }
        if (passphrase.find('\0') == std::string::npos) {
            return util::Error{Untranslated("Error: Wallet decryption failed, the wallet passphrase was not provided or was incorrect.")};
        } else {
            return util::Error{Untranslated("Error: Wallet decryption failed, the wallet passphrase entered was incorrect. "
                                            "The passphrase contains a null character (ie - a zero byte). "
                                            "If this passphrase was set with a version of this software prior to 25.0, "
                                            "please try again with only the characters up to — but not including — "
                                            "the first null character.")};
        }
    }

    {
        LOCK(local_wallet->cs_wallet);
        // First change to using SQLite
        if (!local_wallet->MigrateToSQLite(error)) return util::Error{error};

        // Do the migration of keys and scripts for non-blank wallets, and cleanup if it fails
        success = local_wallet->IsWalletFlagSet(WALLET_FLAG_BLANK_WALLET);
        if (!success) {
            success = DoMigration(*local_wallet, context, error, res);
        } else {
            // Make sure that descriptors flag is actually set
            local_wallet->SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
        }
    }

    // In case of reloading failure, we need to remember the wallet dirs to remove
    // Set is used as it may be populated with the same wallet directory paths multiple times,
    // both before and after reloading. This ensures the set is complete even if one of the wallets
    // fails to reload.
    std::set<fs::path> wallet_dirs;
    if (success) {
        // Migration successful, unload all wallets locally, then reload them.
        // Reload the main wallet
        wallet_dirs.insert(fs::PathFromString(local_wallet->GetDatabase().Filename()).parent_path());
        success = reload_wallet(local_wallet);
        res.wallet = local_wallet;
        res.wallet_name = wallet_name;
        if (success && res.watchonly_wallet) {
            // Reload watchonly
            wallet_dirs.insert(fs::PathFromString(res.watchonly_wallet->GetDatabase().Filename()).parent_path());
            success = reload_wallet(res.watchonly_wallet);
        }
        if (success && res.solvables_wallet) {
            // Reload solvables
            wallet_dirs.insert(fs::PathFromString(res.solvables_wallet->GetDatabase().Filename()).parent_path());
            success = reload_wallet(res.solvables_wallet);
        }
    }
    if (!success) {
        // Migration failed, cleanup
        // Copy the backup to the actual wallet dir
        fs::path temp_backup_location = fsbridge::AbsPathJoin(GetWalletDir(), backup_filename);
        fs::copy_file(backup_path, temp_backup_location, fs::copy_options::none);

        // Make list of wallets to cleanup
        std::vector<std::shared_ptr<CWallet>> created_wallets;
        if (local_wallet) created_wallets.push_back(std::move(local_wallet));
        if (res.watchonly_wallet) created_wallets.push_back(std::move(res.watchonly_wallet));
        if (res.solvables_wallet) created_wallets.push_back(std::move(res.solvables_wallet));

        // Get the directories to remove after unloading
        for (std::shared_ptr<CWallet>& w : created_wallets) {
            wallet_dirs.emplace(fs::PathFromString(w->GetDatabase().Filename()).parent_path());
        }

        // Unload the wallets
        for (std::shared_ptr<CWallet>& w : created_wallets) {
            if (w->HaveChain()) {
                // Unloading for wallets that were loaded for normal use
                if (!RemoveWallet(context, w, /*load_on_start=*/false)) {
                    error += _("\nUnable to cleanup failed migration");
                    return util::Error{error};
                }
                WaitForDeleteWallet(std::move(w));
            } else {
                // Unloading for wallets in local context
                assert(w.use_count() == 1);
                w.reset();
            }
        }

        // Delete the wallet directories
        for (const fs::path& dir : wallet_dirs) {
            fs::remove_all(dir);
        }

        // Restore the backup
        DatabaseStatus status;
        std::vector<bilingual_str> warnings;
        if (!RestoreWallet(context, temp_backup_location, wallet_name, /*load_on_start=*/std::nullopt, status, error, warnings)) {
            error += _("\nUnable to restore backup of wallet.");
            return util::Error{error};
        }

        // Move the backup to the wallet dir
        fs::copy_file(temp_backup_location, backup_path, fs::copy_options::none);
        fs::remove(temp_backup_location);

        return util::Error{error};
    }
    return res;
}